

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ec_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_5c29f0::ECCurveTest_GPlusMinusG_Test::TestBody
          (ECCurveTest_GPlusMinusG_Test *this)

{
  int iVar1;
  EC_POINT *src;
  char *in_R9;
  pointer *__ptr;
  AssertionResult gtest_ar_;
  UniquePtr<EC_POINT> sum;
  UniquePtr<EC_POINT> p;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_60;
  internal local_58 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_50;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_48;
  AssertHelper local_40;
  string local_38;
  _Head_base<0UL,_ec_point_st_*,_false> local_18;
  
  src = EC_GROUP_get0_generator((EC_GROUP *)(this->super_ECCurveTest).group_);
  local_18._M_head_impl =
       (ec_point_st *)EC_POINT_dup(src,(EC_GROUP *)(this->super_ECCurveTest).group_);
  local_58[0] = (internal)(local_18._M_head_impl != (ec_point_st *)0x0);
  local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_18._M_head_impl == (ec_point_st *)0x0) {
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)0x56dfbc,"false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3b3,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
  }
  else {
    iVar1 = EC_POINT_invert((EC_GROUP *)(this->super_ECCurveTest).group_,
                            (EC_POINT *)local_18._M_head_impl,(BN_CTX *)0x0);
    local_58[0] = (internal)(iVar1 != 0);
    local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if ((bool)local_58[0]) {
      local_48._M_head_impl =
           (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
           EC_POINT_new((EC_GROUP *)(this->super_ECCurveTest).group_);
      local_58[0] = (internal)
                    (local_48._M_head_impl !=
                    (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
      local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      if (local_48._M_head_impl ==
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        testing::Message::Message((Message *)&local_60);
        testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                  (&local_38,local_58,(AssertionResult *)"sum","false","true",in_R9);
        testing::internal::AssertHelper::AssertHelper
                  (&local_40,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                   ,0x3b7,local_38._M_dataplus._M_p);
        testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
LAB_002ed66f:
        testing::internal::AssertHelper::~AssertHelper(&local_40);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_38._M_dataplus._M_p != &local_38.field_2) {
          operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
        }
        if (local_60._M_head_impl !=
            (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
          (**(code **)(*(long *)local_60._M_head_impl + 8))();
        }
      }
      else {
        iVar1 = EC_POINT_add((EC_GROUP *)(this->super_ECCurveTest).group_,
                             (EC_POINT *)local_48._M_head_impl,src,(EC_POINT *)local_18._M_head_impl
                             ,(BN_CTX *)0x0);
        local_58[0] = (internal)(iVar1 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (iVar1 == 0) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_add(group(), sum.get(), g, p.get(), nullptr)",
                     "false","true",in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x3b8,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          goto LAB_002ed66f;
        }
        iVar1 = EC_POINT_is_at_infinity
                          ((EC_GROUP *)(this->super_ECCurveTest).group_,
                           (EC_POINT *)local_48._M_head_impl);
        local_58[0] = (internal)(iVar1 != 0);
        local_50 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
        if (!(bool)local_58[0]) {
          testing::Message::Message((Message *)&local_60);
          testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                    (&local_38,local_58,
                     (AssertionResult *)"EC_POINT_is_at_infinity(group(), sum.get())","false","true"
                     ,in_R9);
          testing::internal::AssertHelper::AssertHelper
                    (&local_40,kNonFatalFailure,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
                     ,0x3b9,local_38._M_dataplus._M_p);
          testing::internal::AssertHelper::operator=(&local_40,(Message *)&local_60);
          goto LAB_002ed66f;
        }
      }
      if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_50,local_50);
      }
      std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
                ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_48);
      goto LAB_002ed6c0;
    }
    testing::Message::Message((Message *)&local_48);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_38,local_58,(AssertionResult *)"EC_POINT_invert(group(), p.get(), nullptr)",
               "false","true",in_R9);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_60,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/fipsmodule/ec/ec_test.cc"
               ,0x3b4,local_38._M_dataplus._M_p);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_60,(Message *)&local_48);
  }
  testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  if (local_48._M_head_impl !=
      (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    (**(code **)(*(long *)local_48._M_head_impl + 8))();
  }
  if (local_50 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)&local_50,local_50);
  }
LAB_002ed6c0:
  std::unique_ptr<ec_point_st,_bssl::internal::Deleter>::~unique_ptr
            ((unique_ptr<ec_point_st,_bssl::internal::Deleter> *)&local_18);
  return;
}

Assistant:

TEST_P(ECCurveTest, GPlusMinusG) {
  const EC_POINT *g = EC_GROUP_get0_generator(group());

  bssl::UniquePtr<EC_POINT> p(EC_POINT_dup(g, group()));
  ASSERT_TRUE(p);
  ASSERT_TRUE(EC_POINT_invert(group(), p.get(), nullptr));

  bssl::UniquePtr<EC_POINT> sum(EC_POINT_new(group()));
  ASSERT_TRUE(sum);
  ASSERT_TRUE(EC_POINT_add(group(), sum.get(), g, p.get(), nullptr));
  EXPECT_TRUE(EC_POINT_is_at_infinity(group(), sum.get()));
}